

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTPrinter.cc
# Opt level: O0

void __thiscall flow::lang::ASTPrinter::print(ASTPrinter *this,char *title,ASTNode *node)

{
  ASTNode *node_local;
  char *title_local;
  ASTPrinter *this_local;
  
  enter(this);
  if (node == (ASTNode *)0x0) {
    printf<char_const*>(this,"%s (nil)\n",title);
  }
  else {
    printf<char_const*>(this,"%s\n",title);
    enter(this);
    (*node->_vptr_ASTNode[2])(node,this);
    leave(this);
  }
  leave(this);
  return;
}

Assistant:

void ASTPrinter::print(const char* title, ASTNode* node) {
  enter();
  if (node) {
    printf("%s\n", title);
    enter();
    node->visit(*this);
    leave();
  } else {
    printf("%s (nil)\n", title);
  }
  leave();
}